

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_3::DBIter::DBIter
          (DBIter *this,DBImpl *db,Comparator *cmp,Iterator *iter,SequenceNumber s,uint32_t seed)

{
  ssize_t sVar1;
  uint32_t seed_local;
  SequenceNumber s_local;
  Iterator *iter_local;
  Comparator *cmp_local;
  DBImpl *db_local;
  DBIter *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__DBIter_0015f108;
  this->db_ = db;
  this->user_comparator_ = cmp;
  this->iter_ = iter;
  this->sequence_ = s;
  Status::Status(&this->status_);
  std::__cxx11::string::string((string *)&this->saved_key_);
  std::__cxx11::string::string((string *)&this->saved_value_);
  this->direction_ = kForward;
  this->valid_ = false;
  Random::Random(&this->rnd_,seed);
  sVar1 = RandomPeriod(this);
  this->bytes_counter_ = sVar1;
  return;
}

Assistant:

DBIter(DBImpl *db, const Comparator *cmp, Iterator *iter, SequenceNumber s,
                   uint32_t seed)
                    : db_(db),
                      user_comparator_(cmp),
                      iter_(iter),
                      sequence_(s),
                      direction_(kForward),
                      valid_(false),
                      rnd_(seed),
                      bytes_counter_(RandomPeriod()) {
            }